

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-multiple-listen.c
# Opt level: O2

void connect_cb(uv_connect_t *req,int status)

{
  uv_stream_t *stream;
  int iVar1;
  undefined8 uVar2;
  char *__format;
  char *pcVar3;
  long lVar4;
  long lVar5;
  uv_buf_t uVar6;
  char *pcVar7;
  uv_connect_t *puVar8;
  int64_t eval_b;
  int64_t eval_b_1;
  uv_buf_t send_bufs [4096];
  
  stream = connect_req.handle;
  if (req == &connect_req) {
    eval_b = (int64_t)status;
    send_bufs[0].base = (char *)eval_b;
    if ((uv_connect_t *)eval_b == (uv_connect_t *)0x0) {
      connect_cb_called = connect_cb_called + 1;
      for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
        for (lVar5 = 8; lVar5 != 0x10008; lVar5 = lVar5 + 0x10) {
          uVar6 = uv_buf_init(send_buffer + bytes_sent,0x2728);
          *(char **)((long)send_bufs + lVar5 + -8) = uVar6.base;
          *(size_t *)((long)&send_bufs[0].base + lVar5) = uVar6.len;
          bytes_sent = bytes_sent + 0x2728;
        }
        iVar1 = uv_write(write_reqs + lVar4,stream,send_bufs,0x1000,write_cb);
        eval_b = (int64_t)iVar1;
        eval_b_1 = 0;
        if (eval_b != 0) {
          uVar2 = 0x86;
          goto LAB_00190560;
        }
      }
      iVar1 = uv_shutdown(&shutdown_req,stream,shutdown_cb);
      eval_b = (int64_t)iVar1;
      eval_b_1 = 0;
      if (eval_b == 0) {
        iVar1 = uv_read_start(stream,alloc_cb,read_cb);
        eval_b = (int64_t)iVar1;
        if (eval_b == 0) {
          return;
        }
        uVar2 = 0x8f;
      }
      else {
        uVar2 = 0x8b;
      }
LAB_00190560:
      eval_b_1 = 0;
      pcVar3 = "r";
    }
    else {
      pcVar3 = "status";
      uVar2 = 0x77;
    }
    puVar8 = (uv_connect_t *)0x0;
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
    pcVar7 = "0";
  }
  else {
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
    pcVar3 = "req";
    uVar2 = 0x76;
    puVar8 = &connect_req;
    pcVar7 = "&connect_req";
    eval_b = (int64_t)req;
  }
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-writealot.c"
          ,uVar2,pcVar3,"==",pcVar7,eval_b,"==",puVar8);
  abort();
}

Assistant:

static void connect_cb(uv_connect_t* req, int status) {
  ASSERT_NOT_NULL(req);
  ASSERT_OK(status);
  free(req);
  uv_close((uv_handle_t*)&client, close_cb);
  connect_cb_called++;
}